

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_index.cc
# Opt level: O1

void __thiscall S2CellIndex::RangeIterator::Seek(RangeIterator *this,S2CellId target)

{
  pointer pRVar1;
  pointer pRVar2;
  difference_type __d;
  ulong uVar3;
  ulong uVar4;
  S2LogMessage SStack_18;
  
  if ((target.id_ & 1) != 0) {
    pRVar2 = (this->range_nodes_->
             super__Vector_base<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)(this->range_nodes_->
                  super__Vector_base<S2CellIndex::RangeNode,_std::allocator<S2CellIndex::RangeNode>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar2;
    if (0 < (long)uVar3) {
      uVar3 = (uVar3 >> 2) * -0x5555555555555555;
      do {
        uVar4 = uVar3 >> 1;
        uVar3 = ~uVar4 + uVar3;
        pRVar1 = pRVar2 + uVar4 + 1;
        if (target.id_ < pRVar2[uVar4].start_id.id_) {
          uVar3 = uVar4;
          pRVar1 = pRVar2;
        }
        pRVar2 = pRVar1;
      } while (0 < (long)uVar3);
    }
    (this->it_)._M_current = pRVar2 + -1;
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_18,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_index.cc"
             ,0x19,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_18.stream_,"Check failed: target.is_leaf() ",0x1f);
  abort();
}

Assistant:

void S2CellIndex::RangeIterator::Seek(S2CellId target) {
  S2_DCHECK(target.is_leaf());
  it_ = std::upper_bound(range_nodes_->begin(), range_nodes_->end(),
                         target) - 1;
}